

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

token * __thiscall libchars::commands::find_arg(commands *this,id_t ID)

{
  token *ptVar1;
  token *ptVar2;
  token **pptVar3;
  
  if ((ID != -1) && (this->cmd != (command *)0x0)) {
    pptVar3 = &this->t_par;
    while (ptVar1 = *pptVar3, ptVar1 != (token *)0x0) {
      if (ptVar1->ID == ID) {
        if (ptVar1->ttype != KEY) {
          return ptVar1;
        }
        ptVar2 = ptVar1->next;
        if (ptVar2 == (token *)0x0) {
          return (token *)0x0;
        }
        if (ptVar2->ttype != KEY) {
          return (token *)0x0;
        }
        if ((ptVar2->status & 0x800) != 0) {
          return ptVar1;
        }
        return (token *)0x0;
      }
      pptVar3 = &ptVar1->next;
    }
  }
  return (token *)0x0;
}

Assistant:

token *commands::find_arg(token::id_t ID)
    {
        if (cmd == NULL)
            return NULL;
        if (ID == token::ID_NOT_SET)
            return NULL;

        token *T = t_par;
        while (T != NULL && T->ID != ID)
            T = T->next;

        // special test case: {key,value} pair must have both components
        if (T != NULL && T->ttype == token::KEY) {
            if (T->next == NULL)
                return NULL; // {key,value} pair missing 'value'
            else if (T->next->ttype != token::KEY)
                return NULL; // {key,value} pair missing 'value'
            else if (!(T->next->status & token::IS_VALUE))
                return NULL; // {key,value} pair invalid 'value'
        }

        return T;
    }